

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function_relation.hpp
# Opt level: O2

void __thiscall duckdb::TableFunctionRelation::~TableFunctionRelation(TableFunctionRelation *this)

{
  ~TableFunctionRelation(this);
  operator_delete(this);
  return;
}

Assistant:

~TableFunctionRelation() override {
	}